

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int str_utf8_decode(char **ptr)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  int ch;
  char *buf;
  char **ptr_local;
  int local_4;
  
  pcVar1 = *ptr;
  if (((int)*pcVar1 & 0x80U) == 0) {
    ch = (int)*pcVar1;
    buf = pcVar1 + 1;
LAB_002590f9:
    *ptr = buf;
    local_4 = ch;
  }
  else {
    if (((int)*pcVar1 & 0xe0U) == 0xc0) {
      buf = pcVar1 + 1;
      if ((*buf != '\0') && (((int)*buf & 0xc0U) == 0x80)) {
        ch = ((int)*buf & 0x3fU) + ((int)*pcVar1 & 0x3fU) * 0x40;
        buf = pcVar1 + 2;
        if (((uint)ch < 0x80) || (0x7ff < (uint)ch)) {
          ch = -1;
        }
        goto LAB_002590f9;
      }
    }
    else if (((int)*pcVar1 & 0xf0U) == 0xe0) {
      pcVar2 = pcVar1 + 1;
      buf = pcVar2;
      if ((*pcVar2 != '\0') && (((int)*pcVar2 & 0xc0U) == 0x80)) {
        buf = pcVar1 + 2;
        if ((*buf != '\0') && (((int)*buf & 0xc0U) == 0x80)) {
          ch = ((int)*buf & 0x3fU) + ((int)*pcVar2 & 0x3fU) * 0x40 + ((int)*pcVar1 & 0x1fU) * 0x1000
          ;
          buf = pcVar1 + 3;
          if (((uint)ch < 0x800) || (0xffff < (uint)ch)) {
            ch = -1;
          }
          goto LAB_002590f9;
        }
      }
    }
    else if (((int)*pcVar1 & 0xf8U) == 0xf0) {
      pcVar2 = pcVar1 + 1;
      buf = pcVar2;
      if ((*pcVar2 != '\0') && (((int)*pcVar2 & 0xc0U) == 0x80)) {
        pcVar3 = pcVar1 + 2;
        buf = pcVar3;
        if ((*pcVar3 != '\0') && (((int)*pcVar3 & 0xc0U) == 0x80)) {
          buf = pcVar1 + 3;
          if ((*buf != '\0') && (((int)*buf & 0xc0U) == 0x80)) {
            ch = ((int)*buf & 0x3fU) +
                 ((int)*pcVar3 & 0x3fU) * 0x40 +
                 ((int)*pcVar2 & 0x3fU) * 0x1000 + ((int)*pcVar1 & 0xfU) * 0x40000;
            buf = pcVar1 + 4;
            if (((uint)ch < 0x10000) || (0x10ffff < (uint)ch)) {
              ch = -1;
            }
            goto LAB_002590f9;
          }
        }
      }
    }
    else {
      buf = pcVar1 + 1;
    }
    *ptr = buf;
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int str_utf8_decode(const char **ptr)
{
	const char *buf = *ptr;
	int ch = 0;

	do
	{
		if((*buf&0x80) == 0x0)  /* 0xxxxxxx */
		{
			ch = *buf;
			buf++;
		}
		else if((*buf&0xE0) == 0xC0) /* 110xxxxx */
		{
			ch  = (*buf++ & 0x3F) << 6; if(!(*buf) || (*buf&0xC0) != 0x80) break;
			ch += (*buf++ & 0x3F);
			if(ch < 0x80 || ch > 0x7FF) ch = -1;
		}
		else  if((*buf & 0xF0) == 0xE0)	/* 1110xxxx */
		{
			ch  = (*buf++ & 0x1F) << 12; if(!(*buf) || (*buf&0xC0) != 0x80) break;
			ch += (*buf++ & 0x3F) <<  6; if(!(*buf) || (*buf&0xC0) != 0x80) break;
			ch += (*buf++ & 0x3F);
			if(ch < 0x800 || ch > 0xFFFF) ch = -1;
		}
		else if((*buf & 0xF8) == 0xF0)	/* 11110xxx */
		{
			ch  = (*buf++ & 0x0F) << 18; if(!(*buf) || (*buf&0xC0) != 0x80) break;
			ch += (*buf++ & 0x3F) << 12; if(!(*buf) || (*buf&0xC0) != 0x80) break;
			ch += (*buf++ & 0x3F) <<  6; if(!(*buf) || (*buf&0xC0) != 0x80) break;
			ch += (*buf++ & 0x3F);
			if(ch < 0x10000 || ch > 0x10FFFF) ch = -1;
		}
		else
		{
			/* invalid */
			buf++;
			break;
		}

		*ptr = buf;
		return ch;
	} while(0);

	/* out of bounds */
	*ptr = buf;
	return -1;

}